

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

bool ProcessDifferentials<Blob<64>>
               (vector<Blob<64>,_std::allocator<Blob<64>_>_> *diffs,int reps,bool dumpCollisions)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  byte in_DL;
  int in_ESI;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_RDI;
  double pct_1;
  double pct;
  int i;
  Blob<64> kp;
  bool result;
  int ignore;
  int count;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *in_stack_ffffffffffffffa8;
  __normal_iterator<Blob<64>_*,_std::vector<Blob<64>,_std::allocator<Blob<64>_>_>_>
  in_stack_ffffffffffffffb8;
  double dVar4;
  __normal_iterator<Blob<64>_*,_std::vector<Blob<64>,_std::allocator<Blob<64>_>_>_>
  in_stack_ffffffffffffffc0;
  int local_38;
  Blob<64> local_31;
  byte local_29;
  uint local_28;
  int local_24;
  Blob<64> *local_20;
  Blob<64> *local_18;
  byte local_d;
  int local_c;
  vector<Blob<64>,_std::allocator<Blob<64>_>_> *local_8;
  
  local_d = in_DL & 1;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_18 = (Blob<64> *)
             std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::begin(in_stack_ffffffffffffffa8);
  local_20 = (Blob<64> *)
             std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::end(in_stack_ffffffffffffffa8);
  std::sort<__gnu_cxx::__normal_iterator<Blob<64>*,std::vector<Blob<64>,std::allocator<Blob<64>>>>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_24 = 1;
  local_28 = 0;
  local_29 = 1;
  sVar2 = std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::size(local_8);
  if (sVar2 != 0) {
    pvVar3 = std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::operator[](local_8,0);
    Blob<64>::Blob(&local_31,pvVar3);
    for (local_38 = 1; sVar2 = std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::size(local_8),
        local_38 < (int)sVar2; local_38 = local_38 + 1) {
      pvVar3 = std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::operator[](local_8,(long)local_38)
      ;
      bVar1 = Blob<64>::operator==(pvVar3,&local_31);
      if (bVar1) {
        local_24 = local_24 + 1;
      }
      else {
        if (local_24 < 2) {
          local_28 = local_28 + 1;
        }
        else {
          local_29 = 0;
          in_stack_ffffffffffffffc0._M_current =
               (Blob<64> *)(((double)local_24 / (double)local_c) * 100.0);
          if ((local_d & 1) != 0) {
            printbits(in_stack_ffffffffffffffc0._M_current,
                      (int)((ulong)in_stack_ffffffffffffffb8._M_current >> 0x20));
            printf(" - %4.2f%%\n",in_stack_ffffffffffffffc0._M_current);
          }
        }
        pvVar3 = std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::operator[]
                           (local_8,(long)local_38);
        Blob<64>::operator=(&local_31,pvVar3);
        local_24 = 1;
      }
    }
    if (local_24 < 2) {
      local_28 = local_28 + 1;
    }
    else {
      dVar4 = ((double)local_24 / (double)local_c) * 100.0;
      if ((local_d & 1) != 0) {
        printbits(in_stack_ffffffffffffffc0._M_current,(int)((ulong)dVar4 >> 0x20));
        printf(" - %4.2f%%\n",dVar4);
      }
    }
  }
  sVar2 = std::vector<Blob<64>,_std::allocator<Blob<64>_>_>::size(local_8);
  printf("%d total collisions, of which %d single collisions were ignored",sVar2 & 0xffffffff,
         (ulong)local_28);
  if ((local_29 & 1) == 0) {
    printf(" !!!!!");
  }
  printf("\n\n");
  return (bool)(local_29 & 1);
}

Assistant:

bool ProcessDifferentials ( std::vector<keytype> & diffs, int reps, bool dumpCollisions )
{
  std::sort(diffs.begin(), diffs.end());

  int count = 1;
  int ignore = 0;

  bool result = true;

  if(diffs.size())
  {
    keytype kp = diffs[0];

    for(int i = 1; i < (int)diffs.size(); i++)
    {
      if(diffs[i] == kp)
      {
        count++;
        continue;
      }
      else
      {
        if(count > 1)
        {
          result = false;

          double pct = 100 * (double(count) / double(reps));

          if(dumpCollisions)
          {
            printbits((unsigned char*)&kp,sizeof(kp));
            printf(" - %4.2f%%\n", pct );
          }
        }
        else 
        {
          ignore++;
        }

        kp = diffs[i];
        count = 1;
      }
    }

    if(count > 1)
    {
      double pct = 100 * (double(count) / double(reps));

      if(dumpCollisions)
      {
        printbits((unsigned char*)&kp,sizeof(kp));
        printf(" - %4.2f%%\n", pct );
      }
    }
    else 
    {
      ignore++;
    }
  }

  printf("%d total collisions, of which %d single collisions were ignored",
         (int)diffs.size(),ignore);

  if(result == false)
  {
    printf(" !!!!!");
  }

  printf("\n\n");

  return result;
}